

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# null_mechanism.cpp
# Opt level: O2

status_t __thiscall zmq::null_mechanism_t::status(null_mechanism_t *this)

{
  byte bVar1;
  byte bVar2;
  
  bVar1 = (this->super_zap_client_t).field_0x48;
  bVar2 = (this->super_zap_client_t).field_0x4a;
  if ((bVar1 & bVar2) != 0) {
    return ready;
  }
  return ((byte)((~bVar1 & bVar2 | (this->super_zap_client_t).field_0x4b) &
                (bVar1 | (this->super_zap_client_t).field_0x49)) & 1) * 2;
}

Assistant:

zmq::mechanism_t::status_t zmq::null_mechanism_t::status () const
{
    if (_ready_command_sent && _ready_command_received)
        return ready;

    const bool command_sent = _ready_command_sent || _error_command_sent;
    const bool command_received =
      _ready_command_received || _error_command_received;
    return command_sent && command_received ? error : handshaking;
}